

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

void drwav_f64_to_s16(drwav_int16 *pOut,double *pIn,size_t sampleCount)

{
  double dVar1;
  size_t i;
  ushort uVar2;
  double dVar3;
  
  for (i = 0; sampleCount != i; i = i + 1) {
    dVar1 = pIn[i];
    uVar2 = 0x8000;
    if (-1.0 <= dVar1) {
      dVar3 = 1.0;
      if (dVar1 <= 1.0) {
        dVar3 = dVar1;
      }
      uVar2 = (ushort)(int)((dVar3 + 1.0) * 32767.5) ^ 0x8000;
    }
    pOut[i] = uVar2;
  }
  return;
}

Assistant:

void drwav_f64_to_s16(drwav_int16* pOut, const double* pIn, size_t sampleCount)
{
    int r;
    for (size_t i = 0; i < sampleCount; ++i) {
        double x = pIn[i];
        double c;
        c = ((x < -1) ? -1 : ((x > 1) ? 1 : x));
        c = c + 1;
        r = (int)(c * 32767.5);
        r = r - 32768;
        pOut[i] = (short)r;
    }
}